

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# row_radix_scatter.cpp
# Opt level: O1

void duckdb::TemplatedRadixScatter<duckdb::hugeint_t>
               (UnifiedVectorFormat *vdata,SelectionVector *sel,idx_t add_count,
               data_ptr_t *key_locations,bool desc,bool has_null,bool nulls_first,idx_t offset)

{
  data_ptr_t pdVar1;
  sel_t *psVar2;
  unsigned_long *puVar3;
  data_ptr_t pdVar4;
  ulong uVar5;
  ulong *puVar6;
  idx_t iVar7;
  undefined7 in_register_00000089;
  idx_t s;
  idx_t iVar8;
  ulong uVar9;
  long lVar10;
  
  pdVar1 = vdata->data;
  if ((int)CONCAT71(in_register_00000089,has_null) == 0) {
    if (add_count != 0) {
      iVar7 = 0;
      do {
        iVar8 = iVar7;
        if (sel->sel_vector != (sel_t *)0x0) {
          iVar8 = (idx_t)sel->sel_vector[iVar7];
        }
        psVar2 = vdata->sel->sel_vector;
        if (psVar2 != (sel_t *)0x0) {
          iVar8 = (idx_t)psVar2[iVar8];
        }
        puVar6 = (ulong *)key_locations[iVar7];
        uVar9 = *(ulong *)(pdVar1 + iVar8 * 0x10 + offset * 0x10 + 8);
        uVar5 = *(ulong *)(pdVar1 + iVar8 * 0x10 + offset * 0x10);
        *puVar6 = uVar9 >> 0x38 | (uVar9 & 0xff000000000000) >> 0x28 |
                  (uVar9 & 0xff0000000000) >> 0x18 | (uVar9 & 0xff00000000) >> 8 |
                  (uVar9 & 0xff000000) << 8 | (uVar9 & 0xff0000) << 0x18 | (uVar9 & 0xff00) << 0x28
                  | uVar9 << 0x38;
        *(data_t *)puVar6 = (char)(uVar9 >> 0x38) + 0x80;
        puVar6[1] = uVar5 >> 0x38 | (uVar5 & 0xff000000000000) >> 0x28 |
                    (uVar5 & 0xff0000000000) >> 0x18 | (uVar5 & 0xff00000000) >> 8 |
                    (uVar5 & 0xff000000) << 8 | (uVar5 & 0xff0000) << 0x18 |
                    (uVar5 & 0xff00) << 0x28 | uVar5 << 0x38;
        if (desc) {
          lVar10 = 0;
          do {
            key_locations[iVar7][lVar10] = ~key_locations[iVar7][lVar10];
            lVar10 = lVar10 + 1;
          } while (lVar10 != 0x10);
        }
        key_locations[iVar7] = key_locations[iVar7] + 0x10;
        iVar7 = iVar7 + 1;
      } while (iVar7 != add_count);
    }
  }
  else if (add_count != 0) {
    iVar7 = 0;
    do {
      iVar8 = iVar7;
      if (sel->sel_vector != (sel_t *)0x0) {
        iVar8 = (idx_t)sel->sel_vector[iVar7];
      }
      psVar2 = vdata->sel->sel_vector;
      if (psVar2 != (sel_t *)0x0) {
        iVar8 = (idx_t)psVar2[iVar8];
      }
      uVar9 = iVar8 + offset;
      puVar3 = (vdata->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
      if ((puVar3 == (unsigned_long *)0x0) || ((puVar3[uVar9 >> 6] >> (uVar9 & 0x3f) & 1) != 0)) {
        *key_locations[iVar7] = nulls_first;
        pdVar4 = key_locations[iVar7];
        uVar5 = *(ulong *)(pdVar1 + uVar9 * 0x10 + 8);
        uVar9 = *(ulong *)(pdVar1 + uVar9 * 0x10);
        *(ulong *)(pdVar4 + 1) =
             uVar5 >> 0x38 | (uVar5 & 0xff000000000000) >> 0x28 | (uVar5 & 0xff0000000000) >> 0x18 |
             (uVar5 & 0xff00000000) >> 8 | (uVar5 & 0xff000000) << 8 | (uVar5 & 0xff0000) << 0x18 |
             (uVar5 & 0xff00) << 0x28 | uVar5 << 0x38;
        pdVar4[1] = (char)(uVar5 >> 0x38) + 0x80;
        *(ulong *)(pdVar4 + 9) =
             uVar9 >> 0x38 | (uVar9 & 0xff000000000000) >> 0x28 | (uVar9 & 0xff0000000000) >> 0x18 |
             (uVar9 & 0xff00000000) >> 8 | (uVar9 & 0xff000000) << 8 | (uVar9 & 0xff0000) << 0x18 |
             (uVar9 & 0xff00) << 0x28 | uVar9 << 0x38;
        if (desc) {
          lVar10 = 0;
          do {
            key_locations[iVar7][lVar10 + 1] = ~key_locations[iVar7][lVar10 + 1];
            lVar10 = lVar10 + 1;
          } while (lVar10 != 0x10);
        }
      }
      else {
        *key_locations[iVar7] = !nulls_first;
        pdVar4 = key_locations[iVar7];
        pdVar4[1] = '\0';
        pdVar4[2] = '\0';
        pdVar4[3] = '\0';
        pdVar4[4] = '\0';
        pdVar4[5] = '\0';
        pdVar4[6] = '\0';
        pdVar4[7] = '\0';
        pdVar4[8] = '\0';
        pdVar4[9] = '\0';
        pdVar4[10] = '\0';
        pdVar4[0xb] = '\0';
        pdVar4[0xc] = '\0';
        pdVar4[0xd] = '\0';
        pdVar4[0xe] = '\0';
        pdVar4[0xf] = '\0';
        pdVar4[0x10] = '\0';
      }
      key_locations[iVar7] = key_locations[iVar7] + 0x11;
      iVar7 = iVar7 + 1;
    } while (iVar7 != add_count);
  }
  return;
}

Assistant:

void TemplatedRadixScatter(UnifiedVectorFormat &vdata, const SelectionVector &sel, idx_t add_count,
                           data_ptr_t *key_locations, const bool desc, const bool has_null, const bool nulls_first,
                           const idx_t offset) {
	auto source = UnifiedVectorFormat::GetData<T>(vdata);
	if (has_null) {
		auto &validity = vdata.validity;
		const data_t valid = nulls_first ? 1 : 0;
		const data_t invalid = 1 - valid;

		for (idx_t i = 0; i < add_count; i++) {
			auto idx = sel.get_index(i);
			auto source_idx = vdata.sel->get_index(idx) + offset;
			// write validity and according value
			if (validity.RowIsValid(source_idx)) {
				key_locations[i][0] = valid;
				Radix::EncodeData<T>(key_locations[i] + 1, source[source_idx]);
				// invert bits if desc
				if (desc) {
					for (idx_t s = 1; s < sizeof(T) + 1; s++) {
						*(key_locations[i] + s) = ~*(key_locations[i] + s);
					}
				}
			} else {
				key_locations[i][0] = invalid;
				memset(key_locations[i] + 1, '\0', sizeof(T));
			}
			key_locations[i] += sizeof(T) + 1;
		}
	} else {
		for (idx_t i = 0; i < add_count; i++) {
			auto idx = sel.get_index(i);
			auto source_idx = vdata.sel->get_index(idx) + offset;
			// write value
			Radix::EncodeData<T>(key_locations[i], source[source_idx]);
			// invert bits if desc
			if (desc) {
				for (idx_t s = 0; s < sizeof(T); s++) {
					*(key_locations[i] + s) = ~*(key_locations[i] + s);
				}
			}
			key_locations[i] += sizeof(T);
		}
	}
}